

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::Read
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZStream *buf,void *context)

{
  long lVar1;
  
  TPZGeoCube::Read(&this->super_TPZGeoCube,buf,context);
  for (lVar1 = 0; lVar1 != 0x1e0; lVar1 = lVar1 + 0x18) {
    (**(code **)(*(long *)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) +
                0x30))((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1,buf,
                       context);
  }
  for (lVar1 = 0x230; lVar1 != 0x22b0; lVar1 = lVar1 + 0x1a0) {
    (**(code **)(*(long *)((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.
                                 fNodeIndexes + lVar1 + -8) + 0x30))
              ((long)(this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes
               + lVar1 + -8,buf,context);
  }
  return;
}

Assistant:

void Read(TPZStream &buf, void *context) override{
            TGeo::Read(buf, context);
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fNeighbours[is].Read(buf, context);
            }
            for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
                fTrans[is].Read(buf, context);
            }
        }